

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_split_cubic(PVG_FT_Vector *base)

{
  long lVar1;
  long lVar2;
  long lVar3;
  TPos d;
  TPos c;
  TPos b;
  TPos a;
  PVG_FT_Vector *base_local;
  
  base[6].x = base[3].x;
  lVar3 = base[1].x;
  lVar1 = (base->x + lVar3) / 2;
  base[1].x = lVar1;
  lVar2 = (base[3].x + base[2].x) / 2;
  base[5].x = lVar2;
  lVar3 = (lVar3 + base[2].x) / 2;
  lVar1 = (lVar1 + lVar3) / 2;
  base[2].x = lVar1;
  lVar3 = (lVar2 + lVar3) / 2;
  base[4].x = lVar3;
  base[3].x = (lVar1 + lVar3) / 2;
  base[6].y = base[3].y;
  lVar3 = base[1].y;
  lVar1 = (base->y + lVar3) / 2;
  base[1].y = lVar1;
  lVar2 = (base[3].y + base[2].y) / 2;
  base[5].y = lVar2;
  lVar3 = (lVar3 + base[2].y) / 2;
  lVar1 = (lVar1 + lVar3) / 2;
  base[2].y = lVar1;
  lVar3 = (lVar2 + lVar3) / 2;
  base[4].y = lVar3;
  base[3].y = (lVar1 + lVar3) / 2;
  return;
}

Assistant:

static void
  gray_split_cubic( PVG_FT_Vector*  base )
  {
    TPos  a, b, c, d;


    base[6].x = base[3].x;
    c = base[1].x;
    d = base[2].x;
    base[1].x = a = ( base[0].x + c ) / 2;
    base[5].x = b = ( base[3].x + d ) / 2;
    c = ( c + d ) / 2;
    base[2].x = a = ( a + c ) / 2;
    base[4].x = b = ( b + c ) / 2;
    base[3].x = ( a + b ) / 2;

    base[6].y = base[3].y;
    c = base[1].y;
    d = base[2].y;
    base[1].y = a = ( base[0].y + c ) / 2;
    base[5].y = b = ( base[3].y + d ) / 2;
    c = ( c + d ) / 2;
    base[2].y = a = ( a + c ) / 2;
    base[4].y = b = ( b + c ) / 2;
    base[3].y = ( a + b ) / 2;
  }